

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool adios2sys::SystemTools::TestFileAccess(char *filename,TestFilePermissions permissions)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  if (filename == (char *)0x0) {
    bVar3 = false;
  }
  else {
    local_40 = local_30;
    sVar2 = strlen(filename);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,filename,filename + sVar2);
    if (local_38 == 0) {
      bVar3 = false;
    }
    else {
      iVar1 = access(local_40,permissions);
      bVar3 = iVar1 == 0;
    }
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
  }
  return bVar3;
}

Assistant:

bool SystemTools::TestFileAccess(const char* filename,
                                 TestFilePermissions permissions)
{
  if (!filename) {
    return false;
  }
  return SystemTools::TestFileAccess(std::string(filename), permissions);
}